

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_png.cpp
# Opt level: O0

bool M_AppendPNGChunk(FILE *file,DWORD chunkID,BYTE *chunkData,DWORD len)

{
  size_t sVar1;
  DWORD local_38;
  uint local_34;
  DWORD crc;
  DWORD head [2];
  DWORD len_local;
  BYTE *chunkData_local;
  DWORD chunkID_local;
  FILE *file_local;
  
  head[0] = len;
  unique0x100000c9 = chunkData;
  local_34 = BigLong(len);
  crc = chunkID;
  sVar1 = fwrite(&local_34,1,8,(FILE *)file);
  if (sVar1 == 8) {
    if (head[0] != 0) {
      sVar1 = fwrite(stack0xffffffffffffffd8,1,(ulong)head[0],(FILE *)file);
      if (sVar1 != head[0]) goto LAB_005f0c3a;
    }
    local_38 = CalcCRC32((BYTE *)&crc,4);
    if (head[0] != 0) {
      local_38 = AddCRC32(local_38,stack0xffffffffffffffd8,head[0]);
    }
    local_38 = BigLong(local_38);
    sVar1 = fwrite(&local_38,1,4,(FILE *)file);
    file_local._7_1_ = sVar1 == 4;
  }
  else {
LAB_005f0c3a:
    file_local._7_1_ = false;
  }
  return file_local._7_1_;
}

Assistant:

bool M_AppendPNGChunk (FILE *file, DWORD chunkID, const BYTE *chunkData, DWORD len)
{
	DWORD head[2] = { BigLong((unsigned int)len), chunkID };
	DWORD crc;

	if (fwrite (head, 1, 8, file) == 8 &&
		(len == 0 || fwrite (chunkData, 1, len, file) == len))
	{
		crc = CalcCRC32 ((BYTE *)&head[1], 4);
		if (len != 0)
		{
			crc = AddCRC32 (crc, chunkData, len);
		}
		crc = BigLong((unsigned int)crc);
		return fwrite (&crc, 1, 4, file) == 4;
	}
	return false;
}